

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall
QtMWidgets::TableViewCell::setAccessoryWidget(TableViewCell *this,QWidget *accessory)

{
  TableViewCellLayout *this_00;
  TableViewCellPrivate *pTVar1;
  TableViewCell *pTVar2;
  QWidget *accessory_local;
  TableViewCell *this_local;
  
  pTVar1 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
           ::operator->(&this->d);
  if ((accessory != pTVar1->accessoryWidget) && (accessory != (QWidget *)0x0)) {
    pTVar1 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
             ::operator->(&this->d);
    if (pTVar1->accessoryWidget != (QWidget *)0x0) {
      (**(code **)(*(long *)pTVar1->accessoryWidget + 0x20))();
    }
    pTVar1 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
             ::operator->(&this->d);
    pTVar1->accessoryWidget = (QWidget *)0x0;
    pTVar2 = (TableViewCell *)QWidget::parentWidget(accessory);
    if (pTVar2 != this) {
      QWidget::setParent(accessory);
    }
    pTVar1 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
             ::operator->(&this->d);
    pTVar1->accessoryWidget = accessory;
    pTVar1 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
             ::operator->(&this->d);
    this_00 = pTVar1->layout;
    pTVar1 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
             ::operator->(&this->d);
    TableViewCellLayout::setAccessoryWidget(this_00,pTVar1->accessoryWidget);
    QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
    ::operator->(&this->d);
    QWidget::show();
    QWidget::updateGeometry();
  }
  return;
}

Assistant:

void
TableViewCell::setAccessoryWidget( QWidget * accessory )
{
	if( accessory == d->accessoryWidget || !accessory )
		return;

	delete d->accessoryWidget;
	d->accessoryWidget = 0;
	if( accessory->parentWidget() != this )
		accessory->setParent( this );
	d->accessoryWidget = accessory;
	d->layout->setAccessoryWidget( d->accessoryWidget );
	d->accessoryWidget->show();

	updateGeometry();
}